

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O2

void __thiscall alex::LinearModelBuilder<int>::add(LinearModelBuilder<int> *this,int x,int y)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  longdouble lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  this->count_ = this->count_ + 1;
  auVar7._0_8_ = (double)y;
  lVar6 = (longdouble)x;
  this->x_sum_ = this->x_sum_ + lVar6;
  this->y_sum_ = this->y_sum_ + (longdouble)y;
  this->xx_sum_ = lVar6 * lVar6 + this->xx_sum_;
  this->xy_sum_ = lVar6 * (longdouble)y + this->xy_sum_;
  auVar7._8_8_ = auVar7._0_8_;
  iVar5 = this->x_min_;
  if (x <= this->x_min_) {
    iVar5 = x;
  }
  this->x_min_ = iVar5;
  if (x < this->x_max_) {
    x = this->x_max_;
  }
  this->x_max_ = x;
  auVar1._0_8_ = this->y_min_;
  auVar1._8_8_ = this->y_max_;
  auVar3 = vunpcklpd_avx(auVar1,auVar7);
  auVar8._8_8_ = auVar1._8_8_;
  auVar8._0_8_ = auVar7._0_8_;
  uVar4 = vcmppd_avx512vl(auVar3,auVar8,1);
  bVar2 = (bool)((byte)(uVar4 & 3) & 1);
  uVar4 = (uVar4 & 3) >> 1;
  this->y_min_ = (double)((ulong)bVar2 * auVar1._0_8_ | (ulong)!bVar2 * (long)auVar7._0_8_);
  this->y_max_ = (double)(uVar4 * auVar1._8_8_ | (ulong)!SUB81(uVar4,0) * (long)auVar7._0_8_);
  return;
}

Assistant:

inline void add(T x, int y) {
    count_++;
    x_sum_ += static_cast<long double>(x);
    y_sum_ += static_cast<long double>(y);
    xx_sum_ += static_cast<long double>(x) * x;
    xy_sum_ += static_cast<long double>(x) * y;
    x_min_ = std::min<T>(x, x_min_);
    x_max_ = std::max<T>(x, x_max_);
    y_min_ = std::min<double>(y, y_min_);
    y_max_ = std::max<double>(y, y_max_);
  }